

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ccb0f7::ResizeCspTest_TestResizeCspWorks_Test::TestBody
          (ResizeCspTest_TestResizeCspWorks_Test *this)

{
  undefined1 uVar1;
  bool bVar2;
  unsigned_long *in_RDI;
  AssertionResult gtest_ar;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  ResizingCspVideoSource video;
  aom_img_fmt_t *img_format;
  aom_img_fmt_t *__end1;
  aom_img_fmt_t *__begin1;
  aom_img_fmt_t (*__range1) [2];
  aom_img_fmt_t image_formats [2];
  uint in_stack_ffffffffffffff20;
  undefined2 in_stack_ffffffffffffff24;
  undefined1 in_stack_ffffffffffffff26;
  ResizingCspVideoSource *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  size_type in_stack_ffffffffffffff48;
  HasNewFatalFailureHelper *in_stack_ffffffffffffff50;
  uint local_8c;
  HasNewFatalFailureHelper local_88;
  Message *in_stack_ffffffffffffff98;
  VideoSource in_stack_ffffffffffffffa0;
  int *local_20;
  int local_10 [4];
  
  local_10[0] = 0x102;
  local_10[1] = 0x106;
  local_20 = local_10;
  do {
    if (local_20 == local_10 + 2) {
      return;
    }
    ResizingCspVideoSource::ResizingCspVideoSource
              (in_stack_ffffffffffffff30,(aom_img_fmt_t)((ulong)in_RDI >> 0x20));
    in_RDI[0x7c] = 0x10000;
    *(undefined4 *)(in_RDI + 0x18) = 0x30;
    *(undefined4 *)((long)in_RDI + 0xbc) = 0x30;
    *(undefined4 *)(in_RDI + 0xd) = 0;
    *(uint *)(in_RDI + 7) = (uint)(*local_20 != 0x102);
    uVar1 = testing::internal::AlwaysTrue();
    if ((bool)uVar1) {
      testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
                (in_stack_ffffffffffffff50);
      in_stack_ffffffffffffff26 = testing::internal::AlwaysTrue();
      if ((bool)in_stack_ffffffffffffff26) {
        (**(code **)(in_RDI[3] + 0x10))(in_RDI + 3,&stack0xffffffffffffffa0);
      }
      bVar2 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure(&local_88);
      if (bVar2) {
        local_8c = 4;
      }
      else {
        local_8c = 0;
      }
      testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
                ((HasNewFatalFailureHelper *)
                 CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff26,
                                         CONCAT24(in_stack_ffffffffffffff24,
                                                  in_stack_ffffffffffffff20))));
      if (local_8c == 0) {
        in_stack_ffffffffffffff48 =
             std::
             vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
             ::size((vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
                     *)(in_RDI + 0x7f));
        in_stack_ffffffffffffff44 =
             libaom_test::DummyVideoSource::limit((DummyVideoSource *)&stack0xffffffffffffffa0);
        testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
                  ((char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                   (char *)in_stack_ffffffffffffff30,in_RDI,
                   (uint *)CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff26,
                                                   CONCAT24(in_stack_ffffffffffffff24,local_8c))));
        bVar2 = testing::AssertionResult::operator_cast_to_bool
                          ((AssertionResult *)&stack0xffffffffffffff50);
        in_stack_ffffffffffffff20 = local_8c;
        if (!bVar2) {
          testing::Message::Message((Message *)in_stack_ffffffffffffff50);
          testing::AssertionResult::failure_message((AssertionResult *)0x8e5987);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_ffffffffffffff50,
                     (Type)(in_stack_ffffffffffffff48 >> 0x20),
                     (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     in_stack_ffffffffffffff3c,(char *)in_stack_ffffffffffffff30);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)in_stack_ffffffffffffffa0._vptr_VideoSource,
                     in_stack_ffffffffffffff98);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)
                     CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff26,
                                             CONCAT24(in_stack_ffffffffffffff24,local_8c))));
          testing::Message::~Message((Message *)0x8e59d3);
          in_stack_ffffffffffffff20 = local_8c;
        }
        local_8c = (uint)!bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x8e5a3f);
        if (local_8c == 0) {
          std::
          vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
          ::clear((vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
                   *)0x8e5a5a);
          local_8c = 0;
        }
      }
      else {
        in_stack_ffffffffffffff20 = local_8c;
        if (local_8c == 4) goto LAB_008e5872;
      }
    }
    else {
LAB_008e5872:
      testing::Message::Message((Message *)in_stack_ffffffffffffff50);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_ffffffffffffff50,(Type)(in_stack_ffffffffffffff48 >> 0x20)
                 ,(char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff3c,(char *)in_stack_ffffffffffffff30);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_ffffffffffffffa0._vptr_VideoSource,
                 in_stack_ffffffffffffff98);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff26,
                                         CONCAT24(in_stack_ffffffffffffff24,
                                                  in_stack_ffffffffffffff20))));
      testing::Message::~Message((Message *)0x8e58c7);
      local_8c = 1;
    }
    ResizingCspVideoSource::~ResizingCspVideoSource((ResizingCspVideoSource *)0x8e5a6f);
    if (local_8c != 0) {
      return;
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

TEST_P(ResizeCspTest, TestResizeCspWorks) {
#endif
  const aom_img_fmt_t image_formats[] = { AOM_IMG_FMT_I420, AOM_IMG_FMT_I444 };
  for (const aom_img_fmt_t &img_format : image_formats) {
    ResizingCspVideoSource video(img_format);
    init_flags_ = AOM_CODEC_USE_PSNR;
    cfg_.rc_min_quantizer = cfg_.rc_max_quantizer = 48;
    cfg_.g_lag_in_frames = 0;
    cfg_.g_profile = (img_format == AOM_IMG_FMT_I420) ? 0 : 1;
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));

#if CONFIG_AV1_DECODER
    // Check we decoded the same number of frames as we attempted to encode
    ASSERT_EQ(frame_info_list_.size(), video.limit());
    frame_info_list_.clear();
#endif
  }
}